

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_impl.hpp
# Opt level: O0

vertex_iterator __thiscall
xmotion::
Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>
::ObtainVertexFromVertexMap
          (Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>
           *this,shared_ptr<xmotion::StateExample> *state)

{
  bool bVar1;
  Vertex *this_00;
  _Node_iterator_base<std::pair<const_long,_xmotion::Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>::Vertex_*>,_false>
  s;
  vertex_iterator vVar2;
  unordered_map<long,_xmotion::Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>::Vertex_*,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_xmotion::Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>::Vertex_*>_>_>
  *this_01;
  int64_t in_RDI;
  Vertex *new_vertex;
  iterator it;
  int64_t state_id;
  Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>
  *in_stack_ffffffffffffff18;
  _Node_iterator_base<std::pair<const_long,_xmotion::Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>::Vertex_*>,_false>
  in_stack_ffffffffffffff20;
  __node_type *__x;
  unordered_map<long,_xmotion::Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>::Vertex_*,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_xmotion::Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>::Vertex_*>_>_>
  *this_02;
  shared_ptr<xmotion::StateExample> *s_00;
  shared_ptr<xmotion::StateExample> *in_stack_ffffffffffffff58;
  DefaultIndexer<std::shared_ptr<xmotion::StateExample>_> *in_stack_ffffffffffffff60;
  undefined1 local_68 [32];
  _Node_iterator_base<std::pair<const_long,_xmotion::Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>::Vertex_*>,_false>
  local_48 [3];
  shared_ptr<xmotion::StateExample> local_30;
  Vertex *local_20;
  _Node_iterator_base<std::pair<const_long,_xmotion::Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>::Vertex_*>,_false>
  local_8;
  
  s_00 = &local_30;
  std::shared_ptr<xmotion::StateExample>::shared_ptr
            ((shared_ptr<xmotion::StateExample> *)in_stack_ffffffffffffff20._M_cur,
             (shared_ptr<xmotion::StateExample> *)in_stack_ffffffffffffff18);
  this_00 = (Vertex *)
            DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>::
            operator()<xmotion::StateExample,_true>
                      (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  std::shared_ptr<xmotion::StateExample>::~shared_ptr((shared_ptr<xmotion::StateExample> *)0x10858e)
  ;
  local_20 = this_00;
  local_48[0]._M_cur =
       (__node_type *)
       std::
       unordered_map<long,_xmotion::Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>::Vertex_*,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_xmotion::Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>::Vertex_*>_>_>
       ::find((unordered_map<long,_xmotion::Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>::Vertex_*,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_xmotion::Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>::Vertex_*>_>_>
               *)in_stack_ffffffffffffff18,(key_type *)0x1085b1);
  local_68._24_8_ =
       std::
       unordered_map<long,_xmotion::Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>::Vertex_*,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_xmotion::Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>::Vertex_*>_>_>
       ::end((unordered_map<long,_xmotion::Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>::Vertex_*,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_xmotion::Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>::Vertex_*>_>_>
              *)in_stack_ffffffffffffff18);
  bVar1 = std::__detail::operator==
                    (local_48,(_Node_iterator_base<std::pair<const_long,_xmotion::Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>::Vertex_*>,_false>
                               *)(local_68 + 0x18));
  if (bVar1) {
    s._M_cur = (__node_type *)operator_new(0x78);
    this_02 = (unordered_map<long,_xmotion::Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>::Vertex_*,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_xmotion::Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>::Vertex_*>_>_>
               *)local_68;
    __x = s._M_cur;
    std::shared_ptr<xmotion::StateExample>::shared_ptr
              ((shared_ptr<xmotion::StateExample> *)s._M_cur,
               (shared_ptr<xmotion::StateExample> *)in_stack_ffffffffffffff18);
    Vertex::Vertex(this_00,s_00,in_RDI);
    std::shared_ptr<xmotion::StateExample>::~shared_ptr
              ((shared_ptr<xmotion::StateExample> *)0x108648);
    local_68._16_8_ = s._M_cur;
    vVar2 = vertex_end(in_stack_ffffffffffffff18);
    (((shared_ptr<xmotion::StateExample> *)(local_68._16_8_ + 0x70))->
    super___shared_ptr<xmotion::StateExample,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
         (element_type *)
         vVar2.super_const_vertex_iterator.super_VertexMapTypeIterator.
         super__Node_iterator_base<std::pair<const_long,_xmotion::Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>::Vertex_*>,_false>
         ._M_cur;
    this_01 = (unordered_map<long,_xmotion::Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>::Vertex_*,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_xmotion::Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>::Vertex_*>_>_>
               *)(in_RDI + 8);
    std::
    make_pair<long&,xmotion::Graph<std::shared_ptr<xmotion::StateExample>,double,xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>>>::Vertex*&>
              ((long *)s._M_cur,(Vertex **)this_01);
    std::
    unordered_map<long,xmotion::Graph<std::shared_ptr<xmotion::StateExample>,double,xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>>>::Vertex*,std::hash<long>,std::equal_to<long>,std::allocator<std::pair<long_const,xmotion::Graph<std::shared_ptr<xmotion::StateExample>,double,xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>>>::Vertex*>>>
    ::
    insert<std::pair<long,xmotion::Graph<std::shared_ptr<xmotion::StateExample>,double,xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>>>::Vertex*>>
              (this_02,(pair<long,_xmotion::Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>::Vertex_*>
                        *)__x);
    std::
    unordered_map<long,_xmotion::Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>::Vertex_*,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_xmotion::Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>::Vertex_*>_>_>
    ::find(this_01,(key_type *)0x1086d1);
    vertex_iterator::vertex_iterator((vertex_iterator *)this_01,(VertexMapTypeIterator)s._M_cur);
  }
  else {
    vertex_iterator::vertex_iterator
              ((vertex_iterator *)in_stack_ffffffffffffff18,
               (VertexMapTypeIterator)in_stack_ffffffffffffff20._M_cur);
  }
  return (vertex_iterator)
         (_Node_iterator_base<std::pair<const_long,_xmotion::Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>::Vertex_*>,_false>
          )local_8._M_cur;
}

Assistant:

typename Graph<State, Transition, StateIndexer>::vertex_iterator
Graph<State, Transition, StateIndexer>::ObtainVertexFromVertexMap(State state) {
  int64_t state_id = GetStateIndex(state);
  auto it = vertex_map_.find(state_id);

  if (it == vertex_map_.end()) {
    auto new_vertex = new Vertex(state, state_id);
    new_vertex->search_parent = vertex_end();
    vertex_map_.insert(std::make_pair(state_id, new_vertex));
    return vertex_iterator(vertex_map_.find(state_id));
  }

  return vertex_iterator(it);
}